

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Module *wasm,
          ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  Name name;
  SmallVector<wasm::Literal,_1UL> local_b0;
  undefined1 auStack_78 [8];
  Literals arguments;
  
  (this->super_ExpressionRunner<wasm::ModuleRunner>).module = wasm;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxDepth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).depth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxLoopIterations = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_00158cc8;
  this->wasm = wasm;
  p_Var1 = &(this->globals)._M_t._M_impl.super__Rb_tree_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->callDepth = 0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->droppedSegments)._M_h._M_buckets = &(this->droppedSegments)._M_h._M_single_bucket;
  (this->droppedSegments)._M_h._M_bucket_count = 1;
  (this->droppedSegments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->droppedSegments)._M_h._M_element_count = 0;
  (this->droppedSegments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->droppedSegments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->droppedSegments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memorySizes)._M_h._M_buckets = &(this->memorySizes)._M_h._M_single_bucket;
  (this->memorySizes)._M_h._M_bucket_count = 1;
  (this->memorySizes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memorySizes)._M_h._M_element_count = 0;
  (this->memorySizes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->memorySizes)._M_h._M_rehash_policy._M_next_resize,0,0x198);
  this->externalInterface = externalInterface;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&this->linkedInstances;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              *)arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&linkedInstances_->_M_t);
  (*externalInterface->_vptr_ExternalInterface[3])(externalInterface,&this->globals,wasm);
  ModuleUtils::
  iterDefinedGlobals<wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase(wasm::Module&,wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface*,std::map<wasm::Name,std::shared_ptr<wasm::ModuleRunner>,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::shared_ptr<wasm::ModuleRunner>>>>)::_lambda(wasm::Global*)_1_>
            (wasm,(anon_class_8_1_8991fb9c)this);
  (*externalInterface->_vptr_ExternalInterface[2])(externalInterface,wasm,this);
  initializeTableContents(this);
  initializeMemoryContents(this);
  pcVar2 = (wasm->start).super_IString.str._M_str;
  if (pcVar2 != (char *)0x0) {
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
    ._M_str = (char *)0x0;
    auStack_78 = (undefined1  [8])0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    name.super_IString.str._M_str = pcVar2;
    name.super_IString.str._M_len = (wasm->start).super_IString.str._M_len;
    callFunction((Literals *)&local_b0,this,name,(Literals *)auStack_78);
    SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_b0);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_78);
  }
  return;
}

Assistant:

ModuleRunnerBase(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<SubType>> linkedInstances_ = {})
    : ExpressionRunner<SubType>(&wasm), wasm(wasm),
      externalInterface(externalInterface), linkedInstances(linkedInstances_) {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }